

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

String * Jinx::Impl::ConvertWStringToUtf8(String *__return_storage_ptr__,WString *wStr)

{
  wchar_t wVar1;
  uint uVar2;
  undefined1 uVar3;
  undefined1 *puVar4;
  String *outString;
  pointer pwVar5;
  char outBuffer [5];
  undefined4 local_40;
  undefined1 local_3c [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *local_38;
  
  pwVar5 = (wStr->_M_dataplus)._M_p;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,wStr->_M_string_length);
  local_3c[0] = 0;
  local_40 = 0;
  for (; wVar1 = *pwVar5, wVar1 != L'\0'; pwVar5 = pwVar5 + 1) {
    uVar3 = (undefined1)wVar1;
    puVar4 = (undefined1 *)((long)&local_40 + 1);
    if ((uint)wVar1 < 0x80) {
      local_40 = CONCAT31(local_40._1_3_,uVar3);
    }
    else if ((uint)wVar1 < 0x800) {
      local_40 = CONCAT22(local_40._2_2_,CONCAT11(uVar3,(char)((uint)wVar1 >> 6))) & 0xffff3fff |
                 0x80c0;
      puVar4 = (undefined1 *)((long)&local_40 + 2);
    }
    else if ((uint)wVar1 < 0x10000) {
      uVar2 = CONCAT22(local_40._2_2_,CONCAT11((char)((uint)wVar1 >> 6),(char)((uint)wVar1 >> 0xc)))
              & 0xffff3fff;
      local_40._3_1_ = (undefined1)(uVar2 >> 0x18);
      local_40 = CONCAT13(local_40._3_1_,CONCAT12(uVar3,(short)uVar2)) & 0xff3fffff | 0x8080e0;
      puVar4 = (undefined1 *)((long)&local_40 + 3);
    }
    else if ((uint)wVar1 < 0x110000) {
      local_40 = CONCAT13(uVar3,CONCAT12((char)((uint)wVar1 >> 6),
                                         CONCAT11((char)((uint)wVar1 >> 0xc),
                                                  (char)((uint)wVar1 >> 0x12)))) & 0x3f3f3fff |
                 0x808080f0;
      puVar4 = local_3c;
    }
    else {
      LogWriteLine(Error,"Invalid character data passed to function ConvertUtf32ToUtf8()");
    }
    *puVar4 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__,(char *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String ConvertWStringToUtf8(const WString & wStr)
	{
		// Compile-time check to determine size of wchar_t, and perform appropriate UTF-16 or UTF-32 conversion
		if constexpr (sizeof(wchar_t) == 4)
		{
			auto cInStr = reinterpret_cast<const char32_t *>(wStr.c_str());
			String outString;
			outString.reserve(wStr.size());
			char outBuffer[5] = { 0, 0, 0, 0, 0 };
			size_t numOut = 0;
			while (*cInStr != 0)
			{
				Impl::ConvertUtf32ToUtf8(*cInStr, outBuffer, std::size(outBuffer), &numOut);
				outBuffer[numOut] = 0;
				++cInStr;
				outString += outBuffer;
			}
			return outString;
		}
		else
		{
			return ConvertUtf16ToUtf8(reinterpret_cast<const char16_t *>(wStr.c_str()));
		}
	}